

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

shared_ptr<MyClass> * __thiscall
estl::shared_ptr<MyClass>::operator=(shared_ptr<MyClass> *this,shared_ptr<MyClass> *o)

{
  shared_ptr<MyClass> *o_local;
  shared_ptr<MyClass> *this_local;
  
  if (this->ptr_ != o->ptr_) {
    decrease_counters(this);
    this->ptr_ = o->ptr_;
    this->control_block_ptr_ = o->control_block_ptr_;
    increase_counters(this);
  }
  return this;
}

Assistant:

shared_ptr<T>& operator=(const shared_ptr<T>& o)
    {
        if (ptr_ == o.ptr_) return *this;
        decrease_counters();
        ptr_ = o.ptr_;
        control_block_ptr_ = o.control_block_ptr_;
        increase_counters();
        return *this;
    }